

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_> *
__thiscall
testing::internal::
MakePredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>>
          (PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>
           *__return_storage_ptr__,internal *this,ElementsAreArrayMatcher<unsigned_long> *matcher)

{
  ElementsAreArrayMatcher<unsigned_long> local_30;
  internal *local_18;
  ElementsAreArrayMatcher<unsigned_long> *matcher_local;
  
  local_18 = this;
  matcher_local = &__return_storage_ptr__->matcher_;
  ElementsAreArrayMatcher<unsigned_long>::ElementsAreArrayMatcher
            (&local_30,(ElementsAreArrayMatcher<unsigned_long> *)this);
  PredicateFormatterFromMatcher<testing::internal::ElementsAreArrayMatcher<unsigned_long>_>::
  PredicateFormatterFromMatcher(__return_storage_ptr__,&local_30);
  ElementsAreArrayMatcher<unsigned_long>::~ElementsAreArrayMatcher(&local_30);
  return __return_storage_ptr__;
}

Assistant:

inline PredicateFormatterFromMatcher<M> MakePredicateFormatterFromMatcher(
    M matcher) {
  return PredicateFormatterFromMatcher<M>(std::move(matcher));
}